

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

Vec4 __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredImage::getPixel
          (LayeredImage *this,int x,int y,int z)

{
  undefined4 in_register_00000034;
  LayeredImage *this_00;
  int in_R8D;
  Vec4 VVar1;
  ConstPixelBufferAccess access;
  ConstPixelBufferAccess local_50;
  
  this_00 = (LayeredImage *)CONCAT44(in_register_00000034,x);
  if (this_00->m_type == TEXTURETYPE_CUBE) {
    getCubeFaceAccess(&local_50,this_00,
                      (&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces)
                      [in_R8D]);
  }
  else {
    getAccess(&local_50,this_00);
  }
  VVar1 = tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)this,(int)&local_50,y,z);
  return (Vec4)VVar1.m_data;
}

Assistant:

Vec4 LayeredImage::getPixel (int x, int y, int z) const
{
	const ConstPixelBufferAccess access = m_type == TEXTURETYPE_CUBE ? getCubeFaceAccess(glslImageFuncZToCubeFace(z)) : getAccess();
	return access.getPixel(x, y, m_type == TEXTURETYPE_CUBE ? 0 : z);
}